

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_distFcnElement.cpp
# Opt level: O0

Real __thiscall
amrex::LineDistFcnElement2d::cpside(LineDistFcnElement2d *this,RealVect pt,RealVect *cpmin)

{
  double dVar1;
  size_type sVar2;
  const_reference pvVar3;
  Real *pRVar4;
  undefined8 *in_RSI;
  LineDistFcnElement2d *in_RDI;
  RealVect in_stack_00000000;
  Real AcrossB;
  RealVect A;
  RealVect B;
  int N;
  int i;
  RealVect l1;
  RealVect l0;
  RealVect cp;
  Real dist;
  Real mindist;
  RealVect *in_stack_fffffffffffffea0;
  RealVect *in_stack_fffffffffffffec8;
  Real RVar5;
  RealVect *in_stack_fffffffffffffed0;
  RealVect local_f0;
  RealVect local_d8;
  RealVect local_c0;
  RealVect local_a8;
  Real local_90;
  Real local_88;
  int local_78;
  int local_74;
  Real local_70;
  Real local_68;
  Real local_60;
  Real local_58;
  Real local_50;
  Real local_48;
  Real *in_stack_ffffffffffffffc0;
  RealVect *in_stack_ffffffffffffffc8;
  Real in_stack_ffffffffffffffd0;
  Real in_stack_ffffffffffffffd8;
  double dVar6;
  LineDistFcnElement2d *this_00;
  Real local_8;
  
  dVar6 = 1e+29;
  this_00 = in_RDI;
  RealVect::RealVect(in_stack_fffffffffffffea0);
  RealVect::RealVect(in_stack_fffffffffffffea0);
  RealVect::RealVect(in_stack_fffffffffffffea0);
  local_74 = 1;
  sVar2 = std::vector<double,_std::allocator<double>_>::size(&in_RDI->control_points_x);
  local_78 = (int)sVar2;
  for (; local_74 < local_78; local_74 = local_74 + 1) {
    local_90 = in_stack_00000000.vect[1];
    local_88 = in_stack_00000000.vect[2];
    std::vector<double,_std::allocator<double>_>::operator[]
              (&in_RDI->control_points_x,(long)(local_74 + -1));
    std::vector<double,_std::allocator<double>_>::operator[]
              (&in_RDI->control_points_x,(long)local_74);
    std::vector<double,_std::allocator<double>_>::operator[]
              (&in_RDI->control_points_y,(long)(local_74 + -1));
    std::vector<double,_std::allocator<double>_>::operator[]
              (&in_RDI->control_points_y,(long)local_74);
    single_seg_cpdist(this_00,in_stack_00000000,(Real)in_RSI,dVar6,in_stack_ffffffffffffffd8,
                      in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0)
    ;
    if (in_stack_ffffffffffffffd8 < dVar6) {
      *in_RSI = in_stack_ffffffffffffffc0;
      in_RSI[1] = in_stack_ffffffffffffffc8;
      in_RSI[2] = in_stack_ffffffffffffffd0;
      dVar6 = in_stack_ffffffffffffffd8;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&in_RDI->control_points_x,(long)(local_74 + -1));
      in_stack_fffffffffffffed0 = (RealVect *)*pvVar3;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&in_RDI->control_points_y,(long)(local_74 + -1));
      RealVect::RealVect(&local_a8,(Real)in_stack_fffffffffffffed0,*pvVar3,0.0);
      local_58 = local_a8.vect[0];
      local_50 = local_a8.vect[1];
      local_48 = local_a8.vect[2];
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&in_RDI->control_points_x,(long)local_74);
      RVar5 = *pvVar3;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&in_RDI->control_points_y,(long)local_74);
      RealVect::RealVect(&local_c0,RVar5,*pvVar3,0.0);
      local_70 = local_c0.vect[0];
      local_68 = local_c0.vect[1];
      local_60 = local_c0.vect[2];
    }
  }
  amrex::operator-(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  amrex::operator-(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  pRVar4 = RealVect::operator[](&local_f0,0);
  dVar6 = *pRVar4;
  pRVar4 = RealVect::operator[](&local_d8,1);
  RVar5 = *pRVar4;
  pRVar4 = RealVect::operator[](&local_f0,1);
  dVar1 = *pRVar4;
  pRVar4 = RealVect::operator[](&local_d8,0);
  dVar6 = dVar6 * RVar5 + -(dVar1 * *pRVar4);
  if (0.0 <= dVar6) {
    if (dVar6 <= 0.0) {
      local_8 = 0.0;
    }
    else {
      local_8 = -1.0;
    }
  }
  else {
    local_8 = 1.0;
  }
  return local_8;
}

Assistant:

amrex::Real LineDistFcnElement2d::cpside(amrex::RealVect pt,
                                         amrex::RealVect & cpmin) const {

  amrex::Real mindist, dist;
  mindist = 1.0e29;
  amrex::RealVect cp;
  amrex::RealVect l0, l1;

  for (int i=1, N=control_points_x.size(); i<N; ++i) {
    single_seg_cpdist(pt,
                      control_points_x[i-1], control_points_x[i],
                      control_points_y[i-1], control_points_y[i],
                      cp, dist);
    if (dist < mindist) {
      mindist = dist;
      cpmin = cp;
      l0 = amrex::RealVect(AMREX_D_DECL(control_points_x[i-1], control_points_y[i-1],0.0));
      l1 = amrex::RealVect(AMREX_D_DECL(control_points_x[i], control_points_y[i],0.0));
    }
  }

  //amrex::RealVect B = l1 - cpmin;
  amrex::RealVect B = l1 - l0;
  amrex::RealVect A = pt - cpmin;
  amrex::Real AcrossB = A[0]*B[1] - A[1]*B[0];

  if (AcrossB < 0.0) {
    return 1.0;
  } else if (AcrossB > 0.0) {
    return -1.0;
  } else {
    return 0.0;
    /*
    // AcrossB is zero, try extending line segment
    if (B[0]*B[0] + B[1]*B[1] != 0.0) {
      amrex::RealVect cext = amrex::RealVect(l1 - l0)*1.05 + l0;
      B = cext - cpmin;
      AcrossB = A[0]*B[1] - A[1]*B[0];
      if (AcrossB < 0.0) {
        return 1.0;
      } else if (AcrossB > 0.0) {
        return -1.0;
      }
    } else {
        // Point must be on the line, put it inside
        return 0.0;
    }
    */
  }
}